

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O0

char * arangodb::velocypack::valueTypeName(ValueType type)

{
  ValueType type_local;
  char *local_8;
  
  switch(type) {
  case None:
    local_8 = "none";
    break;
  case Illegal:
    local_8 = "illegal";
    break;
  case Null:
    local_8 = "null";
    break;
  case Bool:
    local_8 = "bool";
    break;
  case Array:
    local_8 = "array";
    break;
  case Object:
    local_8 = "object";
    break;
  case Double:
    local_8 = "double";
    break;
  case UTCDate:
    local_8 = "utc-date";
    break;
  case External:
    local_8 = "external";
    break;
  case MinKey:
    local_8 = "min-key";
    break;
  case MaxKey:
    local_8 = "max-key";
    break;
  case Int:
    local_8 = "int";
    break;
  case UInt:
    local_8 = "uint";
    break;
  case SmallInt:
    local_8 = "smallint";
    break;
  case String:
    local_8 = "string";
    break;
  case Binary:
    local_8 = "binary";
    break;
  case BCD:
    local_8 = "bcd";
    break;
  case Custom:
    local_8 = "custom";
    break;
  case Tagged:
    local_8 = "tagged";
    break;
  default:
    local_8 = "unknown";
  }
  return local_8;
}

Assistant:

char const* arangodb::velocypack::valueTypeName(ValueType type) {
  switch (type) {
    case ValueType::None:
      return "none";
    case ValueType::Illegal:
      return "illegal";
    case ValueType::Null:
      return "null";
    case ValueType::Bool:
      return "bool";
    case ValueType::Array:
      return "array";
    case ValueType::Object:
      return "object";
    case ValueType::Double:
      return "double";
    case ValueType::UTCDate:
      return "utc-date";
    case ValueType::External:
      return "external";
    case ValueType::MinKey:
      return "min-key";
    case ValueType::MaxKey:
      return "max-key";
    case ValueType::Int:
      return "int";
    case ValueType::UInt:
      return "uint";
    case ValueType::SmallInt:
      return "smallint";
    case ValueType::String:
      return "string";
    case ValueType::Binary:
      return "binary";
    case ValueType::BCD:
      return "bcd";
    case ValueType::Tagged:
      return "tagged";
    case ValueType::Custom:
      return "custom";
  }

  return "unknown";
}